

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

vec3 dja::cross(vec3 *a,vec3 *b)

{
  vec3 vVar1;
  vec3 *b_local;
  vec3 *a_local;
  undefined4 uStack_10;
  float_t local_c;
  
  vec3::vec3((vec3 *)((long)&a_local + 4),a->y * b->z - a->z * b->y,a->z * b->x - a->x * b->z,
             a->x * b->y - a->y * b->x);
  vVar1.z = local_c;
  vVar1.x = (float_t)a_local._4_4_;
  vVar1.y = (float_t)uStack_10;
  return vVar1;
}

Assistant:

V3 cross(const V3& a, const V3& b) {
    return vec3(a.y * b.z - a.z * b.y,
                a.z * b.x - a.x * b.z,
                a.x * b.y - a.y * b.x);
}